

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyweight_test.cc
# Opt level: O0

int main(void)

{
  bool bVar1;
  BoxFactory *pBVar2;
  Box *pBVar3;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [36];
  int local_a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [4];
  int boxcount;
  string color;
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [32];
  Box *local_30;
  Box *redBox;
  BoxFactory *local_18;
  BoxFactory *boxFactory;
  
  boxFactory._4_4_ = 0;
  pBVar2 = (BoxFactory *)operator_new(0x40);
  (pBVar2->map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pBVar2->box).
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Box_*>,_true>
  ._M_cur = (__node_type *)0x0;
  *(undefined8 *)&(pBVar2->map)._M_h._M_rehash_policy = 0;
  (pBVar2->map)._M_h._M_rehash_policy._M_next_resize = 0;
  (pBVar2->map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pBVar2->map)._M_h._M_element_count = 0;
  (pBVar2->map)._M_h._M_buckets = (__buckets_ptr)0x0;
  (pBVar2->map)._M_h._M_bucket_count = 0;
  BoxFactory::BoxFactory(pBVar2);
  local_18 = pBVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"red",&local_51);
  pBVar3 = BoxFactory::getBox(pBVar2,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pBVar2 = local_18;
  local_30 = pBVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"red",&local_79);
  BoxFactory::getBox(pBVar2,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  Box::getColor_abi_cxx11_((Box *)local_a0);
  bVar1 = std::operator==(local_a0,"red");
  if (!bVar1) {
    __assert_fail("color == \"red\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/flyweight_test.cc"
                  ,0xd,"int main()");
  }
  local_a4 = BoxFactory::boxCount(local_18);
  pBVar2 = local_18;
  if (local_a4 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"green",&local_c9);
    BoxFactory::getBox(pBVar2,(string *)local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    pBVar2 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"green",&local_f1);
    BoxFactory::getBox(pBVar2,(string *)local_f0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    local_a4 = BoxFactory::boxCount(local_18);
    if (local_a4 == 2) {
      std::__cxx11::string::~string((string *)local_a0);
      return boxFactory._4_4_;
    }
    __assert_fail("boxcount == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/flyweight_test.cc"
                  ,0x16,"int main()");
  }
  __assert_fail("boxcount == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/flyweight_test.cc"
                ,0x10,"int main()");
}

Assistant:

int main() {
  BoxFactory* boxFactory = new BoxFactory();
  Box* redBox = boxFactory->getBox("red");
  boxFactory->getBox("red");

  std::string color = redBox->getColor();
  assert(color == "red");

  int boxcount = boxFactory->boxCount();
  assert(boxcount == 1);

  boxFactory->getBox("green");
  boxFactory->getBox("green");

  boxcount = boxFactory->boxCount();
  assert(boxcount == 2);
}